

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O0

int WebPISetIOHooks(WebPIDecoder *idec,VP8IoPutHook put,VP8IoSetupHook setup,
                   VP8IoTeardownHook teardown,void *user_data)

{
  void *user_data_local;
  VP8IoTeardownHook teardown_local;
  VP8IoSetupHook setup_local;
  VP8IoPutHook put_local;
  WebPIDecoder *idec_local;
  int local_4;
  
  if ((idec == (WebPIDecoder *)0x0) || (idec->state != STATE_WEBP_HEADER)) {
    local_4 = 0;
  }
  else {
    (idec->io).put = put;
    (idec->io).setup = setup;
    (idec->io).teardown = teardown;
    (idec->io).opaque = user_data;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int WebPISetIOHooks(WebPIDecoder* const idec,
                    VP8IoPutHook put,
                    VP8IoSetupHook setup,
                    VP8IoTeardownHook teardown,
                    void* user_data) {
  if (idec == NULL || idec->state > STATE_WEBP_HEADER) {
    return 0;
  }

  idec->io.put = put;
  idec->io.setup = setup;
  idec->io.teardown = teardown;
  idec->io.opaque = user_data;

  return 1;
}